

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.h
# Opt level: O0

void __thiscall
llvm::sys::fs::directory_iterator::directory_iterator
          (directory_iterator *this,directory_entry *de,error_code *ec,bool follow_symlinks)

{
  element_type *this_00;
  undefined8 uVar1;
  undefined1 in_R8B;
  error_code eVar2;
  StringRef path;
  DirIterState *local_68 [2];
  int local_58;
  undefined4 uStack_54;
  error_category *local_50;
  shared_ptr<llvm::sys::fs::detail::DirIterState> local_48;
  byte local_31;
  error_code *peStack_30;
  bool follow_symlinks_local;
  error_code *ec_local;
  directory_entry *de_local;
  directory_iterator *this_local;
  DirIterState **local_10;
  
  local_31 = follow_symlinks;
  peStack_30 = ec;
  ec_local = (error_code *)de;
  de_local = (directory_entry *)this;
  std::shared_ptr<llvm::sys::fs::detail::DirIterState>::shared_ptr(&this->State);
  this->FollowSymlinks = (bool)(local_31 & 1);
  std::make_shared<llvm::sys::fs::detail::DirIterState>();
  std::shared_ptr<llvm::sys::fs::detail::DirIterState>::operator=(&this->State,&local_48);
  std::shared_ptr<llvm::sys::fs::detail::DirIterState>::~shared_ptr(&local_48);
  this_00 = std::
            __shared_ptr_access<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  this_local = (directory_iterator *)directory_entry::path_abi_cxx11_((directory_entry *)ec_local);
  local_10 = local_68;
  local_68[0] = (DirIterState *)std::__cxx11::string::data();
  uVar1 = std::__cxx11::string::length();
  path.Length._0_1_ = this->FollowSymlinks & 1;
  path.Data = (char *)uVar1;
  path.Length._1_7_ = 0;
  eVar2 = detail::directory_iterator_construct((detail *)this_00,local_68[0],path,(bool)in_R8B);
  local_50 = eVar2._M_cat;
  local_58 = eVar2._M_value;
  *(ulong *)peStack_30 = CONCAT44(uStack_54,local_58);
  peStack_30->_M_cat = local_50;
  update_error_code_for_current_entry(this,peStack_30);
  return;
}

Assistant:

explicit directory_iterator(const directory_entry &de, std::error_code &ec,
                              bool follow_symlinks = true)
      : FollowSymlinks(follow_symlinks) {
    State = std::make_shared<detail::DirIterState>();
    ec = detail::directory_iterator_construct(
        *State, de.path(), FollowSymlinks);
    update_error_code_for_current_entry(ec);
  }